

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

void check_call(wasm_func_t *func,int32_t arg1,int32_t arg2,int32_t expected)

{
  long lVar1;
  wasm_val_t results [1];
  wasm_val_t args [2];
  
  args[0].kind = '\0';
  args[1].kind = '\0';
  args[0].of._0_4_ = arg1;
  args[1].of._0_4_ = arg2;
  lVar1 = wasm_func_call(func,args,results);
  if ((lVar1 == 0) && (results[0].of.i32 == expected)) {
    return;
  }
  puts("> Error on result");
  exit(1);
}

Assistant:

void check_call(wasm_func_t* func, int32_t arg1, int32_t arg2, int32_t expected) {
  wasm_val_t args[2] = {
    {.kind = WASM_I32, .of = {.i32 = arg1}},
    {.kind = WASM_I32, .of = {.i32 = arg2}}
  };
  wasm_val_t results[1];
  if (wasm_func_call(func, args, results) || results[0].of.i32 != expected) {
    printf("> Error on result\n");
    exit(1);
  }
}